

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O0

void Eigen::internal::
     generic_product_impl<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,-1,1,0,-1,1>const>,1>,Eigen::Matrix<float,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,8>
     ::evalTo<Eigen::Matrix<float,_1,_1,0,_1,_1>>
               (Matrix<float,__1,__1,_0,__1,__1> *dst,
               Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>
               *lhs,Matrix<float,__1,__1,_0,__1,__1> *rhs)

{
  PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *rhs_00;
  Matrix<float,__1,__1,_0,__1,__1> *lhs_00;
  Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>
  *dst_00;
  Index IVar1;
  Index IVar2;
  Index IVar3;
  Scalar local_28;
  assign_op<float,_float> local_21;
  PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *local_20;
  Matrix<float,__1,__1,_0,__1,__1> *rhs_local;
  Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>
  *lhs_local;
  Matrix<float,__1,__1,_0,__1,__1> *dst_local;
  
  local_20 = &rhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>;
  rhs_local = (Matrix<float,__1,__1,_0,__1,__1> *)lhs;
  lhs_local = (Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>
               *)dst;
  IVar1 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&rhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>);
  IVar2 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)lhs_local);
  IVar3 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                    ((PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)lhs_local);
  if ((IVar1 + IVar2 + IVar3 < 0x14) &&
     (IVar1 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::rows(local_20),
     dst_00 = lhs_local, lhs_00 = rhs_local, rhs_00 = local_20, 0 < IVar1)) {
    assign_op<float,_float>::assign_op(&local_21);
    generic_product_impl<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,-1,1,0,-1,1>const>,1>,Eigen::Matrix<float,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,3>
    ::eval_dynamic<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::internal::assign_op<float,float>>
              ((Matrix<float,__1,__1,_0,__1,__1> *)dst_00,
               (Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>
                *)lhs_00,(Matrix<float,__1,__1,_0,__1,__1> *)rhs_00,&local_21);
    return;
  }
  DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)lhs_local);
  local_28 = 1.0;
  scaleAndAddTo<Eigen::Matrix<float,_1,_1,0,_1,_1>>
            ((Matrix<float,__1,__1,_0,__1,__1> *)lhs_local,
             (Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>
              *)rhs_local,(Matrix<float,__1,__1,_0,__1,__1> *)local_20,&local_28);
  return;
}

Assistant:

static void evalTo(Dst& dst, const Lhs& lhs, const Rhs& rhs)
  {
    // See http://eigen.tuxfamily.org/bz/show_bug.cgi?id=404 for a discussion and helper program
    // to determine the following heuristic.
    // EIGEN_GEMM_TO_COEFFBASED_THRESHOLD is typically defined to 20 in GeneralProduct.h,
    // unless it has been specialized by the user or for a given architecture.
    // Note that the condition rhs.rows()>0 was required because lazy product is (was?) not happy with empty inputs.
    // I'm not sure it is still required.
    if((rhs.rows()+dst.rows()+dst.cols())<EIGEN_GEMM_TO_COEFFBASED_THRESHOLD && rhs.rows()>0)
      lazyproduct::eval_dynamic(dst, lhs, rhs, internal::assign_op<typename Dst::Scalar,Scalar>());
    else
    {
      dst.setZero();
      scaleAndAddTo(dst, lhs, rhs, Scalar(1));
    }
  }